

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::Slacking::setParameters(Slacking *this,string *method,string *data)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> complete_url;
  string *data_local;
  string *method_local;
  Slacking *this_local;
  
  std::operator+(local_40,&this->base_url);
  Session::SetUrl(&this->session_,local_40);
  Session::SetBody(&this->session_,data);
  poVar1 = std::operator<<((ostream *)&std::cout,">> sending: ");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,(string *)data);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void setParameters(const std::string& method, const std::string& data = "") {
        auto complete_url =  base_url+ method;
        session_.SetUrl(complete_url);
        session_.SetBody(data);

#if SLACKING_VERBOSE_OUTPUT
        std::cout << ">> sending: "<< complete_url << "  " << data << '\n';
#endif

    }